

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexStats.cpp
# Opt level: O1

void __thiscall UnifiedRegex::RegexStats::Add(RegexStats *this,RegexStats *other)

{
  int i;
  long lVar1;
  
  lVar1 = 1;
  do {
    this->phaseTicks[lVar1 + -1] = this->phaseTicks[lVar1 + -1] + other->phaseTicks[lVar1 + -1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    this->useCounts[lVar1] = this->useCounts[lVar1] + other->useCounts[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  this->inputLength = this->inputLength + other->inputLength;
  this->numCompares = this->numCompares + other->numCompares;
  this->numPushes = this->numPushes + other->numPushes;
  this->numPops = this->numPops + other->numPops;
  if (this->stackHWM < other->stackHWM) {
    this->stackHWM = other->stackHWM;
  }
  this->numInsts = this->numInsts + other->numInsts;
  return;
}

Assistant:

void RegexStats::Add(RegexStats* other)
    {
        for (int i = 0; i < NumPhases; i++)
            phaseTicks[i] += other->phaseTicks[i];
        for (int i = 0; i < NumUses; i++)
            useCounts[i] += other->useCounts[i];
        inputLength += other->inputLength;
        numCompares += other->numCompares;
        numPushes += other->numPushes;
        numPops += other->numPops;
        if (other->stackHWM > stackHWM)
            stackHWM = other->stackHWM;
        numInsts += other->numInsts;
    }